

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O0

void print_test_failed<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test failed. ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," != ");
  poVar1 = std::operator<<(poVar1,(string *)rhs);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_test_failed(const T& lhs, const T& rhs)
{
#if WIN32
	HANDLE console = GetStdHandle(STD_OUTPUT_HANDLE);
	CONSOLE_SCREEN_BUFFER_INFO info;
	GetConsoleScreenBufferInfo(console, &info);
	SetConsoleTextAttribute(console, FOREGROUND_RED);
#endif
	std::cout << "Test failed. " << lhs << " != " << rhs << std::endl;
#if WIN32
	SetConsoleTextAttribute(console, info.wAttributes);
#endif

}